

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O1

void __thiscall CompoundFile::Stream::seekToNextSector(Stream *this)

{
  int iVar1;
  int iVar2;
  pointer pSVar3;
  Header *pHVar4;
  pointer pSVar5;
  int iVar6;
  ulong uVar7;
  
  if (this->m_mode == LargeStream) {
    iVar1 = this->m_largeSecIDIdx;
    uVar7 = (long)iVar1 + 1;
    this->m_largeSecIDIdx = (int32_t)uVar7;
    pSVar3 = (this->m_largeStreamChain).
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(this->m_largeStreamChain).
                              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2)) {
      iVar6 = 0;
      std::istream::seekg((long)this->m_stream,
                          pSVar3[(long)iVar1 + 1].m_id * this->m_sectorSize + 0x200);
      pSVar3 = (this->m_largeStreamChain).
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((ulong)(long)this->m_largeSecIDIdx <
          (ulong)((long)(this->m_largeStreamChain).
                        super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2)) {
        (this->m_currentLargeSectorID).m_id = pSVar3[this->m_largeSecIDIdx].m_id;
        std::istream::read((char *)this->m_stream,
                           (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
        goto LAB_00118aba;
      }
    }
  }
  else {
    iVar1 = this->m_shortSecIDIdx;
    uVar7 = (long)iVar1 + 1;
    this->m_shortSecIDIdx = (int32_t)uVar7;
    pSVar3 = (this->m_shortStreamChain).
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(this->m_shortStreamChain).
                              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2)) {
      pHVar4 = this->m_header;
      pSVar5 = (this->m_largeStreamChain).
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar6 = pHVar4->m_sectorSize / pHVar4->m_shortSectorSize;
      iVar1 = pSVar3[(long)iVar1 + 1].m_id;
      uVar7 = (ulong)(iVar1 / iVar6);
      if (uVar7 < (ulong)((long)(this->m_largeStreamChain).
                                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 2)) {
        iVar2 = pSVar5[uVar7].m_id;
        if ((this->m_currentLargeSectorID).m_id != iVar2) {
          (this->m_currentLargeSectorID).m_id = iVar2;
          std::istream::seekg((long)this->m_stream,pHVar4->m_sectorSize * iVar2 + 0x200);
          std::istream::read((char *)this->m_stream,
                             (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        }
        iVar6 = (iVar1 % iVar6) * this->m_header->m_shortSectorSize;
LAB_00118aba:
        this->m_pos = iVar6;
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

inline void
Stream::seekToNextSector()
{
	if( m_mode == LargeStream )
	{
		++m_largeSecIDIdx;

		m_stream.seekg( calcFileOffset( m_largeStreamChain.at( m_largeSecIDIdx ),
			m_sectorSize ), std::ios::beg );

		m_currentLargeSectorID = m_largeStreamChain.at( m_largeSecIDIdx );

		m_stream.read( &m_buf[ 0 ], m_sectorSize );

		m_pos = 0;
	}
	else
	{
		++m_shortSecIDIdx;

		SecID largeSector;
		const int32_t offset =
			whereIsShortSector( m_shortStreamChain.at( m_shortSecIDIdx ),
				largeSector );

		if( m_currentLargeSectorID != largeSector )
		{
			m_currentLargeSectorID = largeSector;

			std::streampos pos = calcFileOffset( largeSector,
				m_header.sectorSize() );

			m_stream.seekg( pos, std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_header.sectorSize() );
		}

		m_pos = offset * m_header.shortSectorSize();
	}
}